

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O0

int ddPickArbitraryMinterms(DdManager *dd,DdNode *node,int nvars,int nminterms,char **string)

{
  int nminterms_00;
  int iVar1;
  uint *puVar2;
  double dVar3;
  double dVar4;
  double min2;
  double min1;
  int result;
  int t;
  int i;
  DdNode *bzero;
  DdNode *one;
  DdNode *E;
  DdNode *T;
  DdNode *N;
  char **string_local;
  int nminterms_local;
  int nvars_local;
  DdNode *node_local;
  DdManager *dd_local;
  
  if ((string == (char **)0x0) || (node == (DdNode *)0x0)) {
    dd_local._4_4_ = 0;
  }
  else if ((nminterms == 0) || (node == (DdNode *)((ulong)dd->one ^ 1))) {
    dd_local._4_4_ = 1;
  }
  else if (node == dd->one) {
    dd_local._4_4_ = 1;
  }
  else {
    puVar2 = (uint *)((ulong)node & 0xfffffffffffffffe);
    E = *(DdNode **)(puVar2 + 4);
    one = *(DdNode **)(puVar2 + 6);
    if (((ulong)node & 1) != 0) {
      E = (DdNode *)((ulong)E ^ 1);
      one = (DdNode *)((ulong)one ^ 1);
    }
    dVar3 = Cudd_CountMinterm(dd,E,nvars);
    dVar3 = dVar3 / 2.0;
    if ((dVar3 != -1.0) || (NAN(dVar3))) {
      dVar4 = Cudd_CountMinterm(dd,one,nvars);
      dVar4 = dVar4 / 2.0;
      if ((dVar4 != -1.0) || (NAN(dVar4))) {
        nminterms_00 = (int)(((double)nminterms * dVar3) / (dVar3 + dVar4) + 0.5);
        for (result = 0; iVar1 = nminterms_00, result < nminterms_00; result = result + 1) {
          string[result][*puVar2] = '1';
        }
        while (result = iVar1, result < nminterms) {
          string[result][*puVar2] = '0';
          iVar1 = result + 1;
        }
        iVar1 = ddPickArbitraryMinterms(dd,E,nvars,nminterms_00,string);
        if (iVar1 == 0) {
          dd_local._4_4_ = 0;
        }
        else {
          dd_local._4_4_ =
               ddPickArbitraryMinterms(dd,one,nvars,nminterms - nminterms_00,string + nminterms_00);
        }
      }
      else {
        dd_local._4_4_ = 0;
      }
    }
    else {
      dd_local._4_4_ = 0;
    }
  }
  return dd_local._4_4_;
}

Assistant:

static int
ddPickArbitraryMinterms(
  DdManager *dd,
  DdNode *node,
  int nvars,
  int nminterms,
  char **string)
{
    DdNode *N, *T, *E;
    DdNode *one, *bzero;
    int    i, t, result;
    double min1, min2;

    if (string == NULL || node == NULL) return(0);

    /* The constant 0 function has no on-set cubes. */
    one = DD_ONE(dd);
    bzero = Cudd_Not(one);
    if (nminterms == 0 || node == bzero) return(1);
    if (node == one) {
        return(1);
    }

    N = Cudd_Regular(node);
    T = cuddT(N); E = cuddE(N);
    if (Cudd_IsComplement(node)) {
        T = Cudd_Not(T); E = Cudd_Not(E);
    }

    min1 = Cudd_CountMinterm(dd, T, nvars) / 2.0;
    if (min1 == (double)CUDD_OUT_OF_MEM) return(0);
    min2 = Cudd_CountMinterm(dd, E, nvars) / 2.0;
    if (min2 == (double)CUDD_OUT_OF_MEM) return(0);

    t = (int)((double)nminterms * min1 / (min1 + min2) + 0.5);
    for (i = 0; i < t; i++)
        string[i][N->index] = '1';
    for (i = t; i < nminterms; i++)
        string[i][N->index] = '0';

    result = ddPickArbitraryMinterms(dd,T,nvars,t,&string[0]);
    if (result == 0)
        return(0);
    result = ddPickArbitraryMinterms(dd,E,nvars,nminterms-t,&string[t]);
    return(result);

}